

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool duckdb::TrySimpleIntegerCast<unsigned_short,false>
               (char *buf,idx_t len,unsigned_short *result,bool strict)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ushort uVar5;
  char *pcVar6;
  ulong uVar7;
  byte bVar8;
  duckdb *pdVar9;
  ulong uVar10;
  short sVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  byte bVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int16_t local_5a;
  IntegerDecimalCastData<unsigned_short> local_58;
  ulong local_40;
  ulong local_38;
  
  if (len == 0) {
    return false;
  }
  uVar3 = 0;
  do {
    bVar18 = buf[uVar3];
    if ((4 < bVar18 - 9) && (bVar18 != 0x20)) {
      if (bVar18 == 0x2d) {
        uVar12 = len - uVar3;
        uVar10 = 1;
        goto LAB_017e5221;
      }
      if (bVar18 == 0x30 && len - 1 != uVar3) {
        bVar19 = buf[uVar3 + 1];
        if (bVar19 < 0x62) {
          if (bVar19 == 0x42) {
LAB_017e54ef:
            uVar10 = ~uVar3 + len;
            if (1 < uVar10) {
              uVar12 = 1;
              uVar5 = 0;
              goto LAB_017e550a;
            }
            break;
          }
          if (bVar19 == 0x58) {
LAB_017e53ce:
            uVar10 = ~uVar3 + len;
            if (1 < uVar10) {
              uVar12 = 1;
              uVar15 = 0;
              goto LAB_017e53f3;
            }
            break;
          }
        }
        else {
          if (bVar19 == 0x62) goto LAB_017e54ef;
          if (bVar19 == 0x78) goto LAB_017e53ce;
        }
      }
      uVar12 = len - uVar3;
      uVar10 = (ulong)(bVar18 == 0x2b);
      if (uVar12 <= uVar10) {
        uVar5 = 0;
        uVar21 = 1;
        goto LAB_017e5611;
      }
      uVar5 = 0;
      uVar7 = uVar10;
      goto LAB_017e528f;
    }
    uVar3 = uVar3 + 1;
  } while (len != uVar3);
  goto LAB_017e56cf;
  while (lVar4 = uVar3 + uVar10, uVar10 = uVar10 + 1, buf[lVar4] == '0') {
LAB_017e5221:
    if (uVar12 <= uVar10) {
      if (len - 1 != uVar3) {
        uVar5 = 0;
        uVar10 = 1;
        goto LAB_017e5338;
      }
      break;
    }
  }
  goto LAB_017e56cf;
  while( true ) {
    uVar5 = uVar5 * 10 - (ushort)(byte)(bVar18 - 0x30);
    uVar21 = uVar12;
    if (~uVar10 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar10] == '_') {
      if (((len - uVar10) - 2 == uVar3) ||
         (uVar21 = uVar10 + 2, 9 < (byte)(buf[uVar3 + uVar21] - 0x30U))) goto LAB_017e56cf;
    }
    else {
      uVar21 = uVar10 + 1;
    }
    uVar10 = uVar21;
    if (uVar12 <= uVar21) break;
LAB_017e5338:
    bVar18 = buf[uVar3 + uVar10];
    if (9 < (byte)(bVar18 - 0x30)) {
      uVar7 = uVar10;
      if (bVar18 == 0x2e) {
        uVar7 = uVar10 + 1;
        if (uVar12 <= uVar7) {
          if (uVar10 < 2) goto LAB_017e56cf;
          goto LAB_017e5692;
        }
        if ((uVar10 < 2) || (bVar18 = buf[uVar3 + 1 + uVar10], (byte)(bVar18 - 0x30) < 10))
        goto LAB_017e56cf;
      }
      if ((4 < bVar18 - 9) && (bVar18 != 0x20)) goto LAB_017e56cf;
      uVar7 = uVar7 + 1;
      uVar21 = uVar7;
      if (uVar7 < uVar12) goto LAB_017e5664;
      break;
    }
  }
  goto LAB_017e568c;
  while (uVar7 = uVar7 + 1, uVar21 = uVar12, uVar12 != uVar7) {
LAB_017e5664:
    if ((4 < (byte)buf[uVar3 + uVar7] - 9) && (buf[uVar3 + uVar7] != 0x20)) goto LAB_017e56cf;
  }
LAB_017e568c:
  if (1 < uVar21) goto LAB_017e5692;
  goto LAB_017e56cf;
  while( true ) {
    uVar7 = uVar10;
    if ((len - uVar12) - 2 != uVar3) {
      if (buf[uVar3 + 2 + uVar12] == '_') {
        if (((len - uVar12) - 3 == uVar3) || ((buf[uVar3 + 3 + uVar12] & 0xfeU) != 0x30))
        goto LAB_017e56cf;
        uVar7 = uVar12 + 2;
      }
      else {
        uVar7 = uVar12 + 1;
      }
    }
    uVar12 = uVar7;
    if ((short)uVar5 < 0) goto LAB_017e56cf;
    uVar5 = sVar11 + uVar5 * 2;
    if (uVar10 <= uVar12) break;
LAB_017e550a:
    if (buf[uVar3 + 1 + uVar12] == '0') {
      sVar11 = 0;
    }
    else {
      if (buf[uVar3 + 1 + uVar12] != '1') goto LAB_017e56cf;
      sVar11 = 1;
    }
  }
  goto LAB_017e5692;
  while( true ) {
    uVar12 = uVar7;
    if ((uVar13 >> 4 & 0xf ^ 0xfff) < (uVar15 & 0xffff)) goto LAB_017e56cf;
    uVar15 = uVar15 * 0x10 + (uVar13 & 0xff);
    uVar5 = (ushort)uVar15;
    if (uVar10 <= uVar12) break;
LAB_017e53f3:
    bVar18 = buf[uVar3 + 1 + uVar12];
    bVar19 = bVar18 | 0x20;
    if (0x19 < (byte)(bVar18 + 0xbf)) {
      bVar19 = bVar18;
    }
    uVar13 = bVar19 - 0x30;
    if ((byte)(bVar19 + 0x9f) < 6 || (byte)uVar13 < 10) {
      uVar14 = bVar19 - 0x57;
      if (bVar19 < 0x61) {
        uVar14 = uVar13;
      }
      uVar13 = uVar14 & 0xff;
    }
    else if (5 < (byte)(bVar19 + 0xbf)) goto LAB_017e56cf;
    uVar7 = uVar10;
    if ((len - uVar12) - 2 != uVar3) {
      if (buf[uVar3 + 2 + uVar12] == '_') {
        if ((len - uVar12) - 3 == uVar3) goto LAB_017e56cf;
        uVar7 = uVar12 + 2;
        if ((9 < (byte)(buf[uVar3 + 3 + uVar12] - 0x30U)) &&
           ((uVar14 = (byte)buf[uVar3 + 3 + uVar12] - 0x41, 0x25 < uVar14 ||
            ((0x3f0000003fU >> ((ulong)uVar14 & 0x3f) & 1) == 0)))) goto LAB_017e56cf;
      }
      else {
        uVar7 = uVar12 + 1;
      }
    }
  }
  goto LAB_017e5692;
  while( true ) {
    if ((ushort)~(ushort)bVar19 / 10 < uVar5) goto LAB_017e56cf;
    uVar5 = (ushort)bVar19 + uVar5 * 10;
    uVar21 = uVar12;
    if (~uVar7 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar7] == '_') {
      if (((len - uVar7) - 2 == uVar3) ||
         (uVar7 = uVar7 + 2, 9 < (byte)(buf[uVar3 + uVar7] - 0x30U))) goto LAB_017e56cf;
    }
    else {
      uVar7 = uVar7 + 1;
    }
    uVar21 = uVar7;
    if (uVar12 <= uVar7) break;
LAB_017e528f:
    bVar18 = buf[uVar3 + uVar7];
    bVar19 = bVar18 - 0x30;
    if (9 < bVar19) {
      uVar21 = uVar7;
      if (bVar18 == 0x2e) {
        uVar21 = uVar7 + 1;
        if (uVar12 <= uVar21) {
          if (uVar7 <= uVar10) goto LAB_017e56cf;
          break;
        }
        if ((uVar7 <= uVar10) || (bVar18 = buf[uVar3 + 1 + uVar7], (byte)(bVar18 - 0x30) < 10))
        goto LAB_017e56cf;
      }
      if ((4 < bVar18 - 9) && (bVar18 != 0x20)) goto LAB_017e56cf;
      uVar7 = uVar21 + 1;
      uVar21 = uVar7;
      if (uVar7 < uVar12) goto LAB_017e55e6;
      break;
    }
  }
  goto LAB_017e5611;
LAB_017e5b17:
  uVar16 = uVar17;
  bVar18 = buf[uVar3 + uVar21];
  bVar19 = bVar18 - 0x30;
  local_38 = uVar20;
  if (9 < bVar19) {
    local_58._16_8_ = uVar16 & 0xffff;
    if (uVar21 <= uVar20 && uVar7 <= uVar12) {
      return false;
    }
LAB_017e5d27:
    uVar15 = (uint)bVar18;
    if (bVar18 < 0x20) {
      if (4 < uVar15 - 9) {
        return false;
      }
LAB_017e5d3d:
      uVar21 = uVar21 + 1;
      uVar22 = uVar21;
      if (uVar21 < uVar10) {
        do {
          if ((4 < (byte)buf[uVar3 + uVar21] - 9) && (buf[uVar3 + uVar21] != 0x20)) {
            return false;
          }
          uVar21 = uVar21 + 1;
          uVar22 = uVar10;
        } while (uVar10 != uVar21);
      }
      goto LAB_017e5be1;
    }
    if ((bVar18 != 0x65) && (uVar15 != 0x45)) {
      if (uVar15 != 0x20) {
        return false;
      }
      goto LAB_017e5d3d;
    }
    if (uVar21 == uVar12) {
      return false;
    }
    if (uVar10 <= uVar21 + 1) {
      return false;
    }
    local_5a = 0;
    pdVar9 = (duckdb *)(buf + uVar3 + uVar21 + 1);
    pcVar6 = (char *)(~uVar3 + (len - uVar21));
    if (*pdVar9 == (duckdb)0x2d) {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar9,pcVar6,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar6,bVar2);
    }
    else {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pdVar9,pcVar6,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar6,bVar2);
    }
    if (bVar2 == false) {
      return false;
    }
    bVar2 = IntegerDecimalCastOperation::
            HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_58,local_5a)
    ;
    goto LAB_017e5ac3;
  }
  uVar17 = uVar16;
  if (local_58.decimal <= (long)(((ulong)bVar19 ^ 0x7ffffffffffffffe) / 10)) {
    uVar15 = uVar15 + 1;
    local_58.decimal = local_58.decimal * 10 + (ulong)bVar19;
    uVar17 = (ulong)uVar15;
  }
  uVar22 = uVar10;
  local_40 = uVar16;
  if (~uVar21 + len != uVar3) goto code_r0x017e5b85;
  goto LAB_017e5dd6;
code_r0x017e5b85:
  if (buf[uVar3 + 1 + uVar21] == '_') {
    if ((len - uVar21) - 2 == uVar3) {
      return false;
    }
    uVar21 = uVar21 + 2;
    if (9 < (byte)(buf[uVar3 + uVar21] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar21 = uVar21 + 1;
  }
  uVar22 = uVar21;
  if (uVar10 <= uVar21) goto LAB_017e5dd6;
  goto LAB_017e5b17;
LAB_017e5dd6:
  local_58._16_8_ = uVar17 & 0xffff;
LAB_017e5de6:
  if ((uVar7 <= uVar12) && (uVar22 <= uVar20)) {
    return false;
  }
  goto LAB_017e5be1;
LAB_017e5c35:
  bVar18 = buf[uVar3 + uVar7];
  bVar19 = bVar18 - 0x30;
  local_40 = uVar21;
  if (9 < bVar19) {
    local_58._18_6_ = 0;
    if (uVar7 <= uVar21 && uVar12 < 2) {
      return false;
    }
LAB_017e5e21:
    uVar15 = (uint)bVar18;
    if (0x1f < bVar18) {
      if ((bVar18 != 0x65) && (uVar15 != 0x45)) {
        if (uVar15 != 0x20) {
          return false;
        }
        goto LAB_017e5e37;
      }
      if (uVar7 == 1) {
        return false;
      }
      if (uVar10 <= uVar7 + 1) {
        return false;
      }
      local_5a = 0;
      pdVar9 = (duckdb *)(buf + uVar3 + uVar7 + 1);
      pcVar6 = (char *)(~uVar3 + (len - uVar7));
      if (*pdVar9 == (duckdb)0x2d) {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar9,pcVar6,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar6,bVar2);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pdVar9,pcVar6,(idx_t)&local_5a,(IntegerCastData<short> *)pcVar6,bVar2);
      }
      if (bVar2 == false) {
        return false;
      }
      bVar2 = IntegerDecimalCastOperation::
              HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                        (&local_58,local_5a);
      goto LAB_017e5ac3;
    }
    if (4 < uVar15 - 9) {
      return false;
    }
LAB_017e5e37:
    uVar7 = uVar7 + 1;
    uVar20 = uVar7;
    if (uVar7 < uVar10) {
      do {
        if ((4 < (byte)buf[uVar3 + uVar7] - 9) && (buf[uVar3 + uVar7] != 0x20)) {
          return false;
        }
        uVar7 = uVar7 + 1;
        uVar20 = uVar10;
      } while (uVar10 != uVar7);
    }
    goto LAB_017e5cd5;
  }
  if (local_58.decimal <= (long)(((ulong)bVar19 ^ 0x7ffffffffffffffe) / 10)) {
    local_58.decimal_digits = uVar5 + 1;
    local_58.decimal = (ulong)bVar19 + local_58.decimal * 10;
    uVar5 = local_58.decimal_digits;
  }
  uVar20 = uVar10;
  if (~uVar7 + len != uVar3) goto code_r0x017e5c88;
  goto LAB_017e5eca;
code_r0x017e5c88:
  if (buf[uVar3 + 1 + uVar7] == '_') {
    if ((len - uVar7) - 2 == uVar3) {
      return false;
    }
    uVar7 = uVar7 + 2;
    if (9 < (byte)(buf[uVar3 + uVar7] - 0x30U)) {
      return false;
    }
  }
  else {
    uVar7 = uVar7 + 1;
  }
  uVar20 = uVar7;
  if (uVar10 <= uVar7) goto LAB_017e5eca;
  goto LAB_017e5c35;
LAB_017e5eca:
  local_58._18_6_ = 0;
LAB_017e5eda:
  if ((uVar12 < 2) && (uVar20 <= uVar21)) {
    return false;
  }
  goto LAB_017e5cd5;
  while (uVar7 = uVar7 + 1, uVar21 = uVar12, uVar12 != uVar7) {
LAB_017e55e6:
    if ((4 < (byte)buf[uVar3 + uVar7] - 9) && (buf[uVar3 + uVar7] != 0x20)) goto LAB_017e56cf;
  }
LAB_017e5611:
  if (uVar10 < uVar21) {
LAB_017e5692:
    *result = uVar5;
    return true;
  }
LAB_017e56cf:
  uVar3 = 0;
  while ((bVar18 = buf[uVar3], bVar18 - 9 < 5 || (bVar18 == 0x20))) {
    uVar3 = uVar3 + 1;
    if (len == uVar3) {
      return false;
    }
  }
  local_58.result = 0;
  local_58.decimal = 0;
  local_58._16_8_ = 0;
  uVar10 = len - uVar3;
  bVar2 = SUB81(uVar10,0);
  if (bVar18 == 0x2d) {
    lVar4 = 1;
    while (uVar10 + (uVar10 == 0) != lVar4) {
      lVar1 = uVar3 + lVar4;
      lVar4 = lVar4 + 1;
      if (buf[lVar1] != '0') {
        return false;
      }
    }
    if (len - 1 == uVar3) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                (&local_58);
      return false;
    }
    uVar12 = 1;
    local_58.result = 0;
    do {
      bVar18 = buf[uVar3 + uVar12];
      bVar19 = bVar18 - 0x30;
      if (9 < bVar19) {
        uVar7 = uVar12;
        if (bVar18 != 0x2e) goto LAB_017e5e21;
        uVar21 = uVar12 + 1;
        uVar20 = uVar21;
        if (uVar10 <= uVar21) goto LAB_017e5eda;
        local_58.decimal = 0;
        local_58.decimal_digits = 0;
        uVar5 = 0;
        uVar7 = uVar21;
        goto LAB_017e5c35;
      }
      uVar7 = (0x8000000000000000 - (ulong)bVar19) / 10;
      if (SBORROW8(local_58.result,-uVar7) != (long)(local_58.result + uVar7) < 0) {
        return false;
      }
      local_58.result = local_58.result * 10 - (ulong)bVar19;
      uVar20 = uVar10;
      if (~uVar12 + len == uVar3) break;
      if (buf[uVar3 + 1 + uVar12] == '_') {
        if ((len - uVar12) - 2 == uVar3) {
          return false;
        }
        uVar12 = uVar12 + 2;
        if (9 < (byte)(buf[uVar3 + uVar12] - 0x30U)) {
          return false;
        }
      }
      else {
        uVar12 = uVar12 + 1;
      }
      uVar20 = uVar12;
    } while (uVar12 < uVar10);
LAB_017e5cd5:
    bVar2 = IntegerDecimalCastOperation::
            Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>(&local_58);
    if (!bVar2) {
      return false;
    }
    if (uVar20 < 2) {
      return false;
    }
    goto LAB_017e5cf5;
  }
  if (bVar18 == 0x30 && len - 1 != uVar3) {
    bVar19 = buf[uVar3 + 1];
    if (bVar19 < 0x62) {
      if (bVar19 == 0x42) {
LAB_017e5a26:
        uVar10 = ~uVar3 + len;
        if (uVar10 < 2) goto LAB_017e5acc;
        uVar12 = 1;
        local_58.result = 0;
        do {
          lVar4 = 0;
          if (buf[uVar3 + 1 + uVar12] != '0') {
            if (buf[uVar3 + 1 + uVar12] != '1') {
              return false;
            }
            lVar4 = 1;
          }
          uVar7 = uVar10;
          if ((len - uVar12) - 2 != uVar3) {
            if (buf[uVar3 + 2 + uVar12] == '_') {
              if ((len - uVar12) - 3 == uVar3) {
                return false;
              }
              if ((buf[uVar3 + 3 + uVar12] & 0xfeU) != 0x30) {
                return false;
              }
              uVar7 = uVar12 + 2;
            }
            else {
              uVar7 = uVar12 + 1;
            }
          }
          uVar12 = uVar7;
          if (0x3fffffffffffffff < local_58.result) {
            return false;
          }
          local_58.result = lVar4 + local_58.result * 2;
        } while (uVar12 < uVar10);
      }
      else {
        if (bVar19 != 0x58) goto LAB_017e5772;
LAB_017e5905:
        uVar10 = ~uVar3 + len;
        if (uVar10 < 2) goto LAB_017e5acc;
        uVar12 = 1;
        local_58.result = 0;
        do {
          bVar18 = buf[uVar3 + 1 + uVar12];
          bVar19 = bVar18 | 0x20;
          if (0x19 < (byte)(bVar18 + 0xbf)) {
            bVar19 = bVar18;
          }
          bVar18 = bVar19 - 0x30;
          if ((byte)(bVar19 + 0x9f) < 6 || bVar18 < 10) {
            bVar8 = bVar19 + 0xa9;
            if (bVar19 < 0x61) {
              bVar8 = bVar18;
            }
          }
          else {
            bVar8 = bVar18;
            if (5 < (byte)(bVar19 + 0xbf)) {
              return false;
            }
          }
          uVar7 = uVar10;
          if ((len - uVar12) - 2 != uVar3) {
            if (buf[uVar3 + 2 + uVar12] == '_') {
              if ((len - uVar12) - 3 == uVar3) {
                return false;
              }
              uVar7 = uVar12 + 2;
              if (9 < (byte)(buf[uVar3 + 3 + uVar12] - 0x30U)) {
                uVar15 = (byte)buf[uVar3 + 3 + uVar12] - 0x41;
                if (0x25 < uVar15) {
                  return false;
                }
                if ((0x3f0000003fU >> ((ulong)uVar15 & 0x3f) & 1) == 0) {
                  return false;
                }
              }
            }
            else {
              uVar7 = uVar12 + 1;
            }
          }
          uVar12 = uVar7;
          if ((long)((ulong)(bVar8 >> 4) ^ 0x7ffffffffffffff) < local_58.result) {
            return false;
          }
          local_58.result = local_58.result * 0x10 + (ulong)bVar8;
        } while (uVar12 < uVar10);
      }
      bVar2 = IntegerDecimalCastOperation::
              Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_58);
LAB_017e5ac3:
      if (bVar2 == false) {
        return false;
      }
      goto LAB_017e5cf5;
    }
    if (bVar19 == 0x62) goto LAB_017e5a26;
    if (bVar19 == 0x78) goto LAB_017e5905;
  }
LAB_017e5772:
  uVar12 = (ulong)(bVar18 == 0x2b);
  if (uVar10 <= uVar12) {
LAB_017e5acc:
    IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
              (&local_58);
    return false;
  }
  local_58.result = 0;
  uVar7 = uVar12;
  do {
    bVar18 = buf[uVar3 + uVar7];
    bVar19 = bVar18 - 0x30;
    if (9 < bVar19) {
      uVar21 = uVar7;
      if (bVar18 != 0x2e) goto LAB_017e5d27;
      uVar20 = uVar7 + 1;
      uVar22 = uVar20;
      if (uVar10 <= uVar20) goto LAB_017e5de6;
      local_58.decimal = 0;
      uVar15 = 0;
      uVar17 = 0;
      uVar21 = uVar20;
      goto LAB_017e5b17;
    }
    if ((long)(((ulong)bVar19 ^ 0x7ffffffffffffffe) / 10) < local_58.result) {
      return false;
    }
    local_58.result = local_58.result * 10 + (ulong)bVar19;
    uVar22 = uVar10;
    if (~uVar7 + len == uVar3) break;
    if (buf[uVar3 + 1 + uVar7] == '_') {
      if ((len - uVar7) - 2 == uVar3) {
        return false;
      }
      uVar7 = uVar7 + 2;
      if (9 < (byte)(buf[uVar3 + uVar7] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar7 = uVar7 + 1;
    }
    uVar22 = uVar7;
  } while (uVar7 < uVar10);
LAB_017e5be1:
  bVar2 = IntegerDecimalCastOperation::
          Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_58);
  if (!bVar2) {
    return false;
  }
  if (uVar22 <= uVar12) {
    return false;
  }
LAB_017e5cf5:
  *result = (unsigned_short)local_58.result;
  return true;
}

Assistant:

static bool TryIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (ZERO_INITIALIZE) {
		memset(&result, 0, sizeof(T));
	}
	// if the number is negative, we set the negative flag and skip the negative sign
	if (*buf == '-') {
		if (!IS_SIGNED) {
			// Need to check if its not -0
			idx_t pos = 1;
			while (pos < len) {
				if (buf[pos++] != '0') {
					return false;
				}
			}
		}
		return IntegerCastLoop<T, true, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
	}
	if (len > 1 && *buf == '0') {
		if (buf[1] == 'x' || buf[1] == 'X') {
			// If it starts with 0x or 0X, we parse it as a hex value
			buf++;
			len--;
			return IntegerHexCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (buf[1] == 'b' || buf[1] == 'B') {
			// If it starts with 0b or 0B, we parse it as a binary value
			buf++;
			len--;
			return IntegerBinaryCastLoop<T, false, false, OP>(buf, len, result, strict);
		} else if (strict && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	return IntegerCastLoop<T, false, ALLOW_EXPONENT, OP, decimal_separator>(buf, len, result, strict);
}